

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O0

bool __thiscall
optimization::livevar_analyse::Livevar_Analyse::bfs_build(Livevar_Analyse *this,BasicBlk *start)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  element_type *peVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  int pre;
  iterator __end4;
  iterator __begin4;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  value_type id;
  bool modify;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  list<int,_std::allocator<int>_> queue;
  Block_Live_Var *in_stack_00000118;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  byte bVar6;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  _Self local_98;
  _Self local_90;
  set<int,_std::less<int>,_std::allocator<int>_> *local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  value_type local_6c;
  byte local_65;
  list<int,_std::allocator<int>_> local_28;
  
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x14e366);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x14e373);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back
            ((list<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_node,
             (value_type_conflict3 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_65 = 0;
  while (bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty(&local_28),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::__cxx11::list<int,_std::allocator<int>_>::front(in_stack_ffffffffffffff20);
    local_6c = *pvVar2;
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       in_stack_ffffffffffffff30._M_node,
                       (key_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (sVar3 == 0) {
      in_stack_ffffffffffffff40 =
           (set<int,_std::less<int>,_std::allocator<int>_> *)
           std::
           map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
           ::at((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                 *)in_stack_ffffffffffffff40,
                (key_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      std::
      __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x14e406);
      in_stack_ffffffffffffff3f = Block_Live_Var::build(in_stack_00000118);
      local_65 = local_65 & 1 | in_stack_ffffffffffffff3f;
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        (in_stack_ffffffffffffff40,
                         (value_type_conflict3 *)
                         CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff30 = pVar5.first._M_node;
      in_stack_ffffffffffffff2f = pVar5.second;
      local_80 = in_stack_ffffffffffffff30._M_node;
      local_78 = in_stack_ffffffffffffff2f;
      in_stack_ffffffffffffff20 =
           (list<int,_std::allocator<int>_> *)
           std::
           map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
           ::at((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                 *)in_stack_ffffffffffffff40,
                (key_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      peVar4 = std::
               __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14e479);
      local_88 = &peVar4->block->preceding;
      local_90._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      local_98._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
        std::_Rb_tree_const_iterator<int>::operator*
                  ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff20);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_node,
                   (value_type_conflict3 *)
                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff20);
      }
    }
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(in_stack_ffffffffffffff20);
  }
  bVar6 = local_65;
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x14e54a);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)0x14e557);
  return (bool)(bVar6 & 1);
}

Assistant:

bool bfs_build(mir::inst::BasicBlk& start) {
    std::list<mir::types::LabelId> queue;
    std::set<mir::types::LabelId> visited;
    queue.push_back(start.id);
    bool modify = false;
    while (!queue.empty()) {
      auto id = queue.front();
      if (!visited.count(id)) {
        modify |= livevars.at(id)->build();
        visited.insert(id);
        for (auto pre : livevars.at(id)->block.preceding) {
          queue.push_back(pre);
        }
      }
      queue.pop_front();
    }

    return modify;
  }